

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

string * __thiscall
flatbuffers::java::JavaGenerator::GenConcreteTypeGet_ObjectAPI_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  string new_type_name;
  size_type type_name_length;
  Type *type_local;
  JavaGenerator *this_local;
  string *type_name;
  
  GenTypeNameDest_abi_cxx11_(__return_storage_ptr__,this,type);
  switch(type->base_type) {
  case BASE_TYPE_STRUCT:
  case BASE_TYPE_ARRAY:
  case BASE_TYPE_VECTOR:
    if (type->struct_def == (StructDef *)0x0) {
      if (type->element == BASE_TYPE_UNION) {
        IdlNamer::NamespacedType_abi_cxx11_
                  (&local_c0,&this->namer_,&type->enum_def->super_Definition);
        Prefixed(&local_a0,this,&local_c0);
        std::operator+(&local_80,&local_a0,"Union");
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
    else {
      new_type_name.field_2._8_8_ = std::__cxx11::string::length();
      IdlNamer::ObjectType_abi_cxx11_((string *)local_50,&this->namer_,type->struct_def);
      lVar1 = std::__cxx11::string::length();
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,lVar1 - new_type_name.field_2._8_8_,
                 (string *)new_type_name.field_2._8_8_);
      std::__cxx11::string::~string((string *)local_50);
    }
    break;
  case BASE_TYPE_UNION:
    IdlNamer::NamespacedType_abi_cxx11_(&local_120,&this->namer_,&type->enum_def->super_Definition);
    Prefixed(&local_100,this,&local_120);
    std::operator+(&local_e0,&local_100,"Union");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  if ((type->base_type == BASE_TYPE_VECTOR) || (type->base_type == BASE_TYPE_ARRAY)) {
    std::operator+(&local_140,__return_storage_ptr__,"[]");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenConcreteTypeGet_ObjectAPI(
      const flatbuffers::Type &type) const {
    auto type_name = GenTypeNameDest(type);
    // Replace to ObjectBaseAPI Type Name
    switch (type.base_type) {
      case BASE_TYPE_STRUCT: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
      case BASE_TYPE_VECTOR: {
        if (type.struct_def != nullptr) {
          auto type_name_length = type.struct_def->name.length();
          auto new_type_name = namer_.ObjectType(*type.struct_def);
          type_name.replace(type_name.length() - type_name_length,
                            type_name_length, new_type_name);
        } else if (type.element == BASE_TYPE_UNION) {
          type_name = Prefixed(namer_.NamespacedType(*type.enum_def)) + "Union";
        }
        break;
      }

      case BASE_TYPE_UNION: {
        type_name = Prefixed(namer_.NamespacedType(*type.enum_def)) + "Union";
        break;
      }
      default: break;
    }

    switch (type.base_type) {
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_VECTOR: {
        type_name = type_name + "[]";
        break;
      }
      default: break;
    }
    return type_name;
  }